

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_err_Error.cpp
# Opt level: O1

StringRef * __thiscall
axl::err::ErrorHdr::getDescription(StringRef *__return_storage_ptr__,ErrorHdr *this)

{
  ulong uVar1;
  BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError> local_48;
  
  sl::callOnce<axl::sl::ConstructSingleton<axl::err::ErrorMgr>,unsigned_char*>
            (sl::getSingleton<axl::err::ErrorMgr>(int*)::buffer);
  local_48.m_p = (ErrorHdr *)0x0;
  local_48.m_hdr = (BufHdr *)0x0;
  local_48.m_size = 0;
  uVar1 = 0x18;
  if (0x18 < this->m_size) {
    uVar1 = (ulong)this->m_size;
  }
  rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::attachBufHdr(&local_48,(BufHdr *)0x0);
  local_48.m_p = this;
  local_48.m_size = uVar1;
  ErrorMgr::getErrorDescription
            (__return_storage_ptr__,(ErrorMgr *)sl::getSingleton<axl::err::ErrorMgr>(int*)::buffer,
             (ErrorRef *)&local_48);
  rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::release(&local_48);
  return __return_storage_ptr__;
}

Assistant:

sl::StringRef
ErrorHdr::getDescription() const {
	return getErrorMgr()->getErrorDescription(this);
}